

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Square.cpp
# Opt level: O0

Square * __thiscall Square::setLeft(Square *this,Square *sq)

{
  code *pcVar1;
  mapped_type pSVar2;
  reference ppSVar3;
  mapped_type *ppSVar4;
  allocator local_39;
  string local_38 [32];
  mapped_type local_18;
  Square *sq_local;
  Square *this_local;
  
  local_18 = sq;
  sq_local = this;
  ppSVar3 = std::vector<Square_*,_std::allocator<Square_*>_>::operator[](&this->adjacents,3);
  pSVar2 = local_18;
  *ppSVar3 = sq;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"left",&local_39);
  ppSVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Square_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Square_*>_>_>
            ::operator[](&this->adjacentMap,(key_type *)local_38);
  *ppSVar4 = pSVar2;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Square *Square::setLeft(Square *sq) {
    this->adjacents[3] = sq;
    this->adjacentMap["left"] = sq;
}